

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>>::
findOrInsert<void_const*>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *this,void **key)

{
  ulong uVar1;
  long lVar2;
  void *pvVar3;
  size_t hash;
  ulong uVar4;
  Node<const_void_*,_(anonymous_namespace)::Data> *pNVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *this_00;
  size_t numBuckets;
  Entry *key_00;
  size_t index;
  long lVar9;
  long in_FS_OFFSET;
  Bucket BVar10;
  R_conflict2 RVar11;
  Bucket local_58;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (Bucket)ZEXT816(0);
  hash = calculateHash<void_const*>(key,*(size_t *)(this + 0x18));
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar1 == 0) {
    BVar10 = (Bucket)ZEXT816(0);
  }
  else {
    BVar10 = findBucketWithHash<void_const*>(this,key,hash);
    bVar7 = true;
    local_58 = BVar10;
    if ((BVar10.span)->offsets[BVar10.index] != 0xff) goto LAB_0034b0a6;
  }
  uVar6 = *(ulong *)(this + 8);
  if (uVar1 >> 1 <= uVar6) {
    uVar4 = uVar6 + 1;
    if (uVar6 + 1 == 0) {
      uVar4 = uVar6;
    }
    numBuckets = 0x80;
    if (0x40 < uVar4) {
      if (uVar4 >> 0x3e == 0) {
        lVar2 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        numBuckets = 1L << (0x41 - ((byte)lVar2 ^ 0x3f) & 0x3f);
      }
      else {
        numBuckets = 0xffffffffffffffff;
      }
    }
    lVar2 = *(long *)(this + 0x20);
    RVar11 = Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::allocateSpans
                       (numBuckets);
    *(Span **)(this + 0x20) = RVar11.spans;
    *(size_t *)(this + 0x10) = numBuckets;
    lVar8 = lVar2;
    for (uVar6 = 0; uVar6 != uVar1 >> 7; uVar6 = uVar6 + 1) {
      this_00 = (Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *)
                (uVar6 * 0x90 + lVar2);
      for (lVar9 = 0; lVar9 != 0x80; lVar9 = lVar9 + 1) {
        if (*(byte *)(lVar8 + lVar9) != 0xff) {
          key_00 = this_00->entries + *(byte *)(lVar8 + lVar9);
          local_48 = findBucket<void_const*>(this,(void **)key_00);
          pNVar5 = Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::Bucket::
                   insert(&local_48);
          pvVar3 = *(void **)((key_00->storage).data + 8);
          pNVar5->key = *(void **)(key_00->storage).data;
          (pNVar5->value).pointer = pvVar3;
        }
      }
      Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::freeData(this_00);
      lVar8 = lVar8 + 0x90;
    }
    if (lVar2 != 0) {
      lVar8 = *(long *)(lVar2 + -8);
      if (lVar8 != 0) {
        lVar9 = lVar8 * 0x90;
        do {
          Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::freeData
                    ((Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *)
                     (lVar9 + lVar2 + -0x90));
          lVar9 = lVar9 + -0x90;
        } while (lVar9 != 0);
      }
      operator_delete__((void *)(lVar2 + -8),lVar8 * 0x90 | 8);
    }
    BVar10 = findBucketWithHash<void_const*>(this,key,hash);
    local_58 = BVar10;
  }
  Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>::Bucket::insert(&local_58);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  bVar7 = false;
LAB_0034b0a6:
  lVar2 = *(long *)(this + 0x20);
  (__return_storage_ptr__->it).d =
       (Data<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *)this;
  (__return_storage_ptr__->it).bucket = ((long)BVar10.span - lVar2) / 0x90 << 7 | BVar10.index;
  __return_storage_ptr__->initialized = bVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }